

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O0

int __thiscall MuxerManager::getDefaultSubTrackIdx(MuxerManager *this,SubTrackMode *mode)

{
  bool bVar1;
  vector<StreamInfo,_std::allocator<StreamInfo>_> *pvVar2;
  ostream *poVar3;
  undefined1 local_40 [4];
  int idx;
  string paramVal;
  SubTrackMode *mode_local;
  MuxerManager *this_local;
  
  paramVal.field_2._8_8_ = mode;
  std::__cxx11::string::string((string *)local_40);
  pvVar2 = METADemuxer::getStreamInfo(&this->m_metaDemuxer);
  this_local._4_4_ =
       (anonymous_namespace)::
       seekDefaultTrack<MuxerManager::getDefaultSubTrackIdx(MuxerManager::SubTrackMode&)const::__0>
                 (pvVar2,local_40);
  if (this_local._4_4_ != -1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"all");
    if (bVar1) {
      *(undefined4 *)paramVal.field_2._8_8_ = 0;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"forced");
      if (bVar1) {
        *(undefined4 *)paramVal.field_2._8_8_ = 1;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "Invalid \'default\' parameter value for subtitle track ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,this_local._4_4_);
        poVar3 = std::operator<<(poVar3,", ignoring");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
        this_local._4_4_ = -1;
      }
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._4_4_;
}

Assistant:

int MuxerManager::getDefaultSubTrackIdx(SubTrackMode& mode) const
{
    std::string paramVal;
    const auto idx = seekDefaultTrack(m_metaDemuxer.getStreamInfo(), paramVal,
                                      [](auto&& streamInfo) { return streamInfo.m_codec[0] == 'S'; });
    if (idx != -1)
    {
        if (paramVal == "all")
        {
            mode = SubTrackMode::All;
        }
        else if (paramVal == "forced")
        {
            mode = SubTrackMode::Forced;
        }
        else
        {
            LTRACE(LT_WARN, 2, "Invalid 'default' parameter value for subtitle track " << idx << ", ignoring");
            return -1;
        }
    }
    return idx;
}